

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

ResolvedDecl * __thiscall
capnp::compiler::Compiler::Node::resolveId
          (ResolvedDecl *__return_storage_ptr__,Node *this,uint64_t id)

{
  Resolver *pRVar1;
  iterator iVar2;
  _func_int *p_Var3;
  Fault local_20;
  key_type_conflict local_18 [2];
  
  local_18[0] = id;
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->module->compiler->nodesById)._M_h,local_18);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (pRVar1 = *(Resolver **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                       ._M_cur + 0x10), pRVar1 != (Resolver *)0x0)) {
    if (pRVar1[2]._vptr_Resolver == (_func_int **)0x0) {
      p_Var3 = (_func_int *)0x0;
    }
    else {
      p_Var3 = pRVar1[2]._vptr_Resolver[9];
    }
    __return_storage_ptr__->id = (uint64_t)pRVar1[9]._vptr_Resolver;
    __return_storage_ptr__->genericParamCount = *(uint *)((long)&pRVar1[0xc]._vptr_Resolver + 4);
    __return_storage_ptr__->scopeId = (uint64_t)p_Var3;
    __return_storage_ptr__->kind = *(Which *)&pRVar1[0xc]._vptr_Resolver;
    __return_storage_ptr__->resolver = pRVar1;
    (__return_storage_ptr__->brand).ptr.isSet = false;
    return __return_storage_ptr__;
  }
  local_20.exception = (Exception *)0x0;
  local_18[0] = 0;
  local_18[1] = 0;
  kj::_::Debug::Fault::init
            (&local_20,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
            );
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

Resolver::ResolvedDecl Compiler::Node::resolveId(uint64_t id) {
  auto& n = KJ_ASSERT_NONNULL(module->getCompiler().findNode(id));
  uint64_t parentId = n.parent.map([](Node& n) { return n.id; }).orDefault(0);
  return { n.id, n.genericParamCount, parentId, n.kind, &n, kj::none };
}